

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

vector<vera::Image,_std::allocator<vera::Image>_> *
vera::scaleSprite(vector<vera::Image,_std::allocator<vera::Image>_> *__return_storage_ptr__,
                 vector<vera::Image,_std::allocator<vera::Image>_> *_in,int _times)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  reference pvVar6;
  int local_1e4;
  undefined1 local_1e0 [4];
  int i_2;
  int local_170;
  int local_16c;
  int i_1;
  int z;
  Image last_layer;
  thread *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  vector<vera::Image,_std::allocator<vera::Image>_> *local_c8;
  size_t local_c0;
  id local_b8;
  pointer local_b0;
  thread local_a8;
  thread t;
  size_t end_layer;
  size_t start_layer;
  size_t i;
  size_t layersLeftOver;
  size_t layersPerThread;
  undefined1 local_70 [4];
  int nThreads;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_48 [8];
  vector<vera::Image,_std::allocator<vera::Image>_> in_scaled;
  size_t out_voxel_resolution;
  size_t in_voxel_resolution;
  int _times_local;
  vector<vera::Image,_std::allocator<vera::Image>_> *_in_local;
  vector<vera::Image,_std::allocator<vera::Image>_> *out;
  
  sVar3 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_in);
  in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 * (long)_times);
  std::vector<vera::Image,_std::allocator<vera::Image>_>::vector
            ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48);
  sVar4 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_in);
  std::vector<vera::Image,_std::allocator<vera::Image>_>::resize
            ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,sVar4);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  iVar2 = std::thread::hardware_concurrency();
  sVar4 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_in);
  uVar5 = sVar4 / (ulong)(long)iVar2;
  sVar4 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_in);
  for (start_layer = 0; start_layer < (ulong)(long)iVar2; start_layer = start_layer + 1) {
    local_c0 = start_layer * uVar5;
    t._M_id._M_thread = (id)(local_c0 + uVar5);
    if (start_layer == (long)(iVar2 + -1)) {
      t._M_id._M_thread = (id)(local_c0 + uVar5 + sVar4 % (ulong)(long)iVar2);
    }
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)local_48;
    local_b8 = t._M_id._M_thread;
    local_b0 = in_scaled.super__Vector_base<vera::Image,_std::allocator<vera::Image>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_c8 = _in;
    std::thread::
    thread<vera::scaleSprite(std::vector<vera::Image,std::allocator<vera::Image>>const&,int)::__0,,void>
              (&local_a8,(type *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_70,&local_a8);
    std::thread::~thread(&local_a8);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  t_1 = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t_1), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  last_layer._111_1_ = 0;
  std::vector<vera::Image,_std::allocator<vera::Image>_>::vector(__return_storage_ptr__);
  Image::Image((Image *)&i_1);
  for (local_16c = 0; (ulong)(long)local_16c < sVar3; local_16c = local_16c + 1) {
    if (local_16c == 0) {
      pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[]
                         ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,0);
      std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                (__return_storage_ptr__,pvVar6);
    }
    else {
      for (local_170 = 1; local_170 < _times; local_170 = local_170 + 1) {
        pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[]
                           ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,
                            (long)local_16c);
        fade((Image *)local_1e0,(Image *)&i_1,pvVar6,(float)local_170 / (float)_times);
        std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_1e0);
        Image::~Image((Image *)local_1e0);
      }
      pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[]
                         ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,
                          (long)local_16c);
      std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                (__return_storage_ptr__,pvVar6);
    }
    if ((long)local_16c == sVar3 - 1) {
      for (local_1e4 = 1; local_1e4 < _times; local_1e4 = local_1e4 + 1) {
        pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[]
                           ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,
                            (long)local_16c);
        std::vector<vera::Image,_std::allocator<vera::Image>_>::push_back
                  (__return_storage_ptr__,pvVar6);
      }
    }
    else {
      pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[]
                         ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48,
                          (long)local_16c);
      Image::operator=((Image *)&i_1,pvVar6);
    }
  }
  last_layer._111_1_ = 1;
  Image::~Image((Image *)&i_1);
  if ((last_layer._111_1_ & 1) == 0) {
    std::vector<vera::Image,_std::allocator<vera::Image>_>::~vector(__return_storage_ptr__);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  std::vector<vera::Image,_std::allocator<vera::Image>_>::~vector
            ((vector<vera::Image,_std::allocator<vera::Image>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image>  scaleSprite(const std::vector<Image>& _in, int _times) {
    size_t in_voxel_resolution = _in.size();
    size_t out_voxel_resolution = in_voxel_resolution * _times;
    std::vector<Image> in_scaled;
    in_scaled.resize(_in.size());

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _in.size() / nThreads;
    size_t layersLeftOver = _in.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t( [&in_scaled, &_in, start_layer, end_layer, out_voxel_resolution]() {
            for (size_t z = start_layer; z < end_layer; z++) {
                in_scaled[z] = vera::scale(_in[z], out_voxel_resolution, out_voxel_resolution);
            }
        });

        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    std::vector<Image> out;
    vera::Image last_layer;
    for (int z = 0; z < in_voxel_resolution; z++) {
        if (z == 0)
            out.push_back( in_scaled[z] );
        else {
            for (int i = 1; i < _times; i++)
                out.push_back( vera::fade(last_layer, in_scaled[z], float(i) / float(_times)) );
            out.push_back( in_scaled[z] );
        }

        if ( z == in_voxel_resolution - 1) {
            for (int i = 1; i < _times; i++)
                out.push_back( in_scaled[z] );
        }
        else 
            last_layer = in_scaled[z];
    }

    return out;
}